

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::GetProperty_Internal<false>
               (Var instance,RecyclableObject *propertyObject,bool isRoot,PropertyId propertyId,
               Var *value,ScriptContext *requestContext,PropertyValueInfo *info)

{
  Type *pTVar1;
  long *plVar2;
  code *pcVar3;
  undefined4 uVar4;
  ScriptContext *pSVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  undefined4 *puVar9;
  undefined4 extraout_var;
  RecyclableObject *pRVar10;
  PropertyRecord *pPVar11;
  RecyclableObject *pRVar12;
  RecyclableObject *pRVar13;
  undefined7 in_register_00000011;
  DynamicObject *dynamicObject;
  BOOL BVar14;
  Var local_58;
  Var property;
  undefined4 local_44;
  ScriptContext *local_40;
  uint local_34;
  
  property = instance;
  local_40 = requestContext;
  local_34 = propertyId;
  bVar6 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar6) {
    PropertyValueInfo::ClearCacheInfo(info);
  }
  local_44 = (undefined4)CONCAT71(in_register_00000011,isRoot);
  pRVar10 = propertyObject;
  if (!isRoot) {
LAB_00acfeee:
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00acff05:
    if (((pRVar10->type).ptr)->typeId == TypeIds_Null) goto LAB_00acffe8;
    iVar8 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x12])
                      (pRVar10,property,(ulong)local_34,value,info,local_40);
    bVar6 = iVar8 == 1;
    if ((iVar8 != 0) || (BVar14 = RecyclableObject::SkipsPrototype(pRVar10), BVar14 != 0))
    goto LAB_00acffeb;
    pTVar1 = (pRVar10->type).ptr;
    if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) != TypeFlagMask_None) {
      if (pTVar1->typeId != TypeIds_Proxy) {
        iVar8 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[6])(pRVar10);
        pRVar10 = (RecyclableObject *)CONCAT44(extraout_var,iVar8);
        goto LAB_00acff05;
      }
      if ((pTVar1->prototype).ptr !=
          (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nullValue.ptr)
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x57a,
                                    "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                    ,
                                    "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                   );
        if (bVar6) {
          *puVar9 = 0;
          goto LAB_00acffc9;
        }
        goto LAB_00ad01d3;
      }
    }
LAB_00acffc9:
    pRVar10 = (pTVar1->prototype).ptr;
    goto LAB_00acff05;
  }
  if ((((propertyObject->type).ptr)->typeId & ~TypeIds_Null) != TypeIds_GlobalObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x755,"(VarIs<RootObjectBase>(object))",
                                "VarIs<RootObjectBase>(object)");
    if (!bVar6) goto LAB_00ad01d3;
    *puVar9 = 0;
  }
  iVar8 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x6c])
                    (propertyObject,property,(ulong)local_34,value,info,local_40);
  if (iVar8 == 0) goto LAB_00acfeee;
  bVar6 = false;
  goto LAB_00acffef;
LAB_00acffe8:
  bVar6 = false;
LAB_00acffeb:
  bVar6 = (bool)(bVar6 ^ 1);
LAB_00acffef:
  if (bVar6) {
    bVar6 = Phases::IsEnabled((Phases *)&DAT_015ca868,MissingPropertyCachePhase);
    if (bVar6) {
      ScriptContext::RecordMissingPropertyMiss(local_40);
    }
    bVar6 = Phases::IsEnabled((Phases *)&DAT_015cd718,MissingPropertyCachePhase);
    uVar4 = local_44;
    if (bVar6) {
      Output::Print(L"MissingPropertyCaching: Missing property %d on slow path.\n",(ulong)local_34);
    }
    pSVar5 = local_40;
    TryCacheMissingProperty(property,propertyObject,SUB41(uVar4,0),local_34,local_40,info);
    pRVar10 = ScriptContext::GetMissingPropertyResult(pSVar5);
    *value = pRVar10;
    BVar14 = 0;
  }
  else {
    bVar6 = DynamicObject::IsBaseDynamicObject(pRVar10);
    pSVar5 = local_40;
    if (bVar6) {
      plVar2 = *(long **)((pRVar10->type).ptr + 1);
      pPVar11 = ScriptContext::GetPropertyName(local_40,local_34);
      cVar7 = (**(code **)(*plVar2 + 0x2e0))(plVar2,pPVar11,&local_58,pSVar5);
      if (cVar7 != '\0') {
        if ((value == (Var *)0x0) || (bVar6 = VarIs<Js::RecyclableObject>(local_58), !bVar6)) {
          bVar6 = false;
        }
        else {
          pRVar12 = VarTo<Js::RecyclableObject>(local_58);
          pRVar13 = VarTo<Js::RecyclableObject>(*value);
          bVar6 = (((((pRVar13->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                  scriptContext.ptr !=
                  (((((pRVar12->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                  scriptContext.ptr;
        }
        if (((value != (Var *)0x0) && (!bVar6)) && (*value != local_58)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x789,
                                      "(skipAssert || value == nullptr || *value == property)",
                                      "skipAssert || value == nullptr || *value == property");
          if (!bVar6) {
LAB_00ad01d3:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
      }
    }
    BVar14 = 1;
    if (((value != (Var *)0x0) &&
        ((((local_40->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr !=
         (UndeclaredBlockVariable *)*value)) &&
       (bVar6 = VarIs<Js::UnscopablesWrapperObject,Js::RecyclableObject>(pRVar10), !bVar6)) {
      CacheOperators::CachePropertyRead
                (propertyObject,pRVar10,local_44._0_1_,local_34,false,info,local_40);
    }
  }
  return BVar14;
}

Assistant:

BOOL JavascriptOperators::GetProperty_Internal(Var instance, RecyclableObject* propertyObject, const bool isRoot, PropertyId propertyId, Var* value, ScriptContext* requestContext, PropertyValueInfo* info)
    {
        if (TaggedNumber::Is(instance))
        {
            PropertyValueInfo::ClearCacheInfo(info);
        }
        RecyclableObject* object = propertyObject;
        BOOL foundProperty = FALSE;
        if (isRoot)
        {
            Assert(VarIs<RootObjectBase>(object));

            RootObjectBase* rootObject = static_cast<RootObjectBase*>(object);
            foundProperty = rootObject->GetRootProperty(instance, propertyId, value, info, requestContext);
        }

        while (!foundProperty && !JavascriptOperators::IsNull(object))
        {
            if (unscopables && IsPropertyUnscopable(object, propertyId))
            {
                break;
            }
            else
            {
                PropertyQueryFlags result = object->GetPropertyQuery(instance, propertyId, value, info, requestContext);
                if (result != PropertyQueryFlags::Property_NotFound)
                {
                    foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                    break;
                }
            }

            if (object->SkipsPrototype())
            {
                break;
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }

        if (foundProperty)
        {
#if ENABLE_FIXED_FIELDS && DBG
            if (DynamicObject::IsBaseDynamicObject(object))
            {
                DynamicObject* dynamicObject = (DynamicObject*)object;
                DynamicTypeHandler* dynamicTypeHandler = dynamicObject->GetDynamicType()->GetTypeHandler();
                Var property;
                if (dynamicTypeHandler->CheckFixedProperty(requestContext->GetPropertyName(propertyId), &property, requestContext))
                {
                    bool skipAssert = false;
                    if (value != nullptr && Js::VarIs<Js::RecyclableObject>(property))
                    {
                        Js::RecyclableObject* pObject = Js::VarTo<Js::RecyclableObject>(property);
                        Js::RecyclableObject* pValue = Js::VarTo<Js::RecyclableObject>(*value);

                        if (pValue->GetScriptContext() != pObject->GetScriptContext())
                        {
                            // value was marshaled. skip check
                            skipAssert = true;
                        }
                    }
                    Assert(skipAssert || value == nullptr || *value == property);
                }
            }
#endif
            // Don't cache the information if the value is undecl block var
            // REVIEW: We might want to only check this if we need to (For LdRootFld or ScopedLdFld)
            //         Also we might want to throw here instead of checking it again in the caller
            if (value && !requestContext->IsUndeclBlockVar(*value) && !VarIs<UnscopablesWrapperObject>(object))
            {
                CacheOperators::CachePropertyRead(propertyObject, object, isRoot, propertyId, false, info, requestContext);
            }
#ifdef TELEMETRY_JSO
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, value, /*successful: */true);
            }
#endif

            return TRUE;
        }

        else
        {
#ifdef MISSING_PROPERTY_STATS
            if (PHASE_STATS1(MissingPropertyCachePhase))
            {
                requestContext->RecordMissingPropertyMiss();
            }
#endif
            if (PHASE_TRACE1(MissingPropertyCachePhase))
            {
                Output::Print(_u("MissingPropertyCaching: Missing property %d on slow path.\n"), propertyId);
            }

            TryCacheMissingProperty(instance, propertyObject, isRoot, propertyId, requestContext, info);

#if defined(TELEMETRY_JSO) || defined(TELEMETRY_AddToCache) // enabled for `TELEMETRY_AddToCache`, because this is the property-not-found codepath where the normal TELEMETRY_AddToCache code wouldn't be executed.
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                if (info && info->AllowResizingPolymorphicInlineCache()) // If in interpreted mode, not JIT.
                {
                    requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, nullptr);
                }
            }
#endif
            *value = requestContext->GetMissingPropertyResult();
            return FALSE;
        }
    }